

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GLES2ThreadTest::Operation::modifyGLObject
          (Operation *this,SharedPtr<deqp::egl::GLES2ThreadTest::Object> *object)

{
  Object *pOVar1;
  SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync> local_48 [2];
  SharedPtr<tcu::ThreadUtil::Event> local_28;
  SharedPtr<deqp::egl::GLES2ThreadTest::Object> *local_18;
  SharedPtr<deqp::egl::GLES2ThreadTest::Object> *object_local;
  Operation *this_local;
  
  local_18 = object;
  object_local = (SharedPtr<deqp::egl::GLES2ThreadTest::Object> *)this;
  pOVar1 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::operator->(object);
  de::SharedPtr<tcu::ThreadUtil::Event>::SharedPtr(&local_28,&(this->super_Operation).m_event);
  tcu::ThreadUtil::Object::modify(&pOVar1->super_Object,&local_28,&(this->super_Operation).m_deps);
  de::SharedPtr<tcu::ThreadUtil::Event>::~SharedPtr(&local_28);
  pOVar1 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::operator->(object);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>::SharedPtr(local_48,&this->m_sync);
  Object::modifyGL(pOVar1,local_48,&this->m_syncDeps);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>::~SharedPtr(local_48);
  return;
}

Assistant:

void Operation::modifyGLObject (SharedPtr<Object> object)
{
	object->modify(m_event, m_deps);
	object->modifyGL(m_sync, m_syncDeps);
}